

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitmap.cpp
# Opt level: O0

void __thiscall TRM::Bitmap::FlipHorizontally(Bitmap *this)

{
  uint uVar1;
  reference __a;
  reference __b;
  uint local_1c;
  int local_18;
  int32_t j;
  int32_t i;
  int32_t half_width;
  Bitmap *this_local;
  
  if (this->fWidth * this->fHeight != 0) {
    uVar1 = this->fWidth;
    for (local_18 = 0; local_18 < (int)(uVar1 >> 1); local_18 = local_18 + 1) {
      for (local_1c = 0; local_1c < this->fHeight; local_1c = local_1c + 1) {
        __a = std::vector<TRM::Color,_std::allocator<TRM::Color>_>::operator[]
                        (&this->fPixels,(ulong)(local_18 + local_1c * this->fWidth));
        __b = std::vector<TRM::Color,_std::allocator<TRM::Color>_>::operator[]
                        (&this->fPixels,
                         (ulong)(((this->fWidth - 1) - local_18) + local_1c * this->fWidth));
        std::swap<TRM::Color>(__a,__b);
      }
    }
  }
  return;
}

Assistant:

void Bitmap::FlipHorizontally() {
  if (fWidth * fHeight <= 0) {
    return;
  }

  int32_t half_width = fWidth >> 1;
  for (int32_t i = 0; i < half_width; i++) {
    for (int32_t j = 0; j < fHeight; j++) {
      std::swap(fPixels[i + j * fWidth], fPixels[fWidth - 1 - i + j * fWidth]);
    }
  }
}